

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_joystick.c
# Opt level: O3

void pollJoystickEvents(void)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  long lVar4;
  anon_struct_56_8_a7991346 *paVar5;
  js_event e;
  regmatch_t match;
  char buffer [16384];
  char local_4058 [4];
  short local_4054;
  byte local_4052;
  byte local_4051;
  regmatch_t local_4040;
  undefined1 local_4038 [12];
  uint uStack_402c;
  char acStack_4028 [16376];
  
  sVar2 = read(_glfw.linux_js.inotify,local_4038,0x4000);
  if (0 < sVar2) {
    lVar4 = 0;
    do {
      iVar1 = regexec((regex_t *)&_glfw.linux_js.regex,acStack_4028 + lVar4,1,&local_4040,0);
      if (iVar1 == 0) {
        snprintf(local_4058,0x14,"/dev/input/%s",acStack_4028 + lVar4);
        openJoystickDevice(local_4058);
      }
      lVar4 = lVar4 + (ulong)*(uint *)((long)&uStack_402c + lVar4) + 0x10;
    } while (lVar4 < sVar2);
  }
  lVar4 = 0;
  do {
    if (_glfw.linux_js.js[lVar4].present != 0) {
      paVar5 = _glfw.linux_js.js + lVar4;
      piVar3 = __errno_location();
      *piVar3 = 0;
      while( true ) {
        sVar2 = read(_glfw.linux_js.js[lVar4].fd,local_4058,8);
        if (sVar2 < 0) break;
        local_4052 = local_4052 & 0x7f;
        if (local_4052 == 1) {
          _glfw.linux_js.js[lVar4].buttons[local_4051] = local_4054 != 0;
        }
        else if (local_4052 == 2) {
          _glfw.linux_js.js[lVar4].axes[local_4051] = (float)(int)local_4054 / 32767.0;
        }
        *piVar3 = 0;
      }
      if (*piVar3 == 0x13) {
        free(_glfw.linux_js.js[lVar4].axes);
        free(_glfw.linux_js.js[lVar4].buttons);
        free(_glfw.linux_js.js[lVar4].name);
        free(_glfw.linux_js.js[lVar4].path);
        *(undefined8 *)&_glfw.linux_js.js[lVar4].buttonCount = 0;
        _glfw.linux_js.js[lVar4].name = (char *)0x0;
        *(undefined8 *)&_glfw.linux_js.js[lVar4].axisCount = 0;
        _glfw.linux_js.js[lVar4].buttons = (uchar *)0x0;
        paVar5->present = 0;
        paVar5->fd = 0;
        _glfw.linux_js.js[lVar4].axes = (float *)0x0;
        _glfw.linux_js.js[lVar4].path = (char *)0x0;
      }
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  return;
}

Assistant:

static void pollJoystickEvents(void)
{
#if defined(__linux__)
    int i;
    struct js_event e;
    ssize_t offset = 0;
    char buffer[16384];

    const ssize_t size = read(_glfw.linux_js.inotify, buffer, sizeof(buffer));

    while (size > offset)
    {
        regmatch_t match;
        const struct inotify_event* e = (struct inotify_event*) (buffer + offset);

        if (regexec(&_glfw.linux_js.regex, e->name, 1, &match, 0) == 0)
        {
            char path[20];
            snprintf(path, sizeof(path), "/dev/input/%s", e->name);
            openJoystickDevice(path);
        }

        offset += sizeof(struct inotify_event) + e->len;
    }

    for (i = 0;  i <= GLFW_JOYSTICK_LAST;  i++)
    {
        if (!_glfw.linux_js.js[i].present)
            continue;

        // Read all queued events (non-blocking)
        for (;;)
        {
            errno = 0;
            if (read(_glfw.linux_js.js[i].fd, &e, sizeof(e)) < 0)
            {
                if (errno == ENODEV)
                {
                    // The joystick was disconnected

                    free(_glfw.linux_js.js[i].axes);
                    free(_glfw.linux_js.js[i].buttons);
                    free(_glfw.linux_js.js[i].name);
                    free(_glfw.linux_js.js[i].path);

                    memset(&_glfw.linux_js.js[i], 0, sizeof(_glfw.linux_js.js[i]));
                }

                break;
            }

            // We don't care if it's an init event or not
            e.type &= ~JS_EVENT_INIT;

            switch (e.type)
            {
                case JS_EVENT_AXIS:
                    _glfw.linux_js.js[i].axes[e.number] =
                        (float) e.value / 32767.0f;
                    break;

                case JS_EVENT_BUTTON:
                    _glfw.linux_js.js[i].buttons[e.number] =
                        e.value ? GLFW_PRESS : GLFW_RELEASE;
                    break;

                default:
                    break;
            }
        }
    }
#endif // __linux__
}